

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll-test.c
# Opt level: O0

void * connector_client(void *arg)

{
  int iVar1;
  undefined1 local_3c [8];
  sockaddr_in addr;
  int i;
  int ret;
  epoll_event event;
  int ep;
  int sock;
  void *arg_local;
  
  event.data.u64._4_4_ = socket(2,0x80001,0);
  if ((int)event.data.u64._4_4_ < 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x42,"sock >= 0");
  }
  if (-1 < connector_epfd) {
    event.data.fd = connector_epfd;
    i = 5;
    ret = event.data.u64._4_4_;
    iVar1 = epoll_ctl(connector_epfd,1,event.data.u64._4_4_,(epoll_event *)&i);
    if (iVar1 != 0) {
      microatf_fail_require
                ("%s:%d: %s not met",
                 "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
                 ,0x4b,"epoll_ctl(ep, EPOLL_CTL_ADD, sock, &event) == 0");
    }
    addr.sin_zero[0] = '\0';
    addr.sin_zero[1] = '\0';
    addr.sin_zero[2] = '\0';
    addr.sin_zero[3] = '\0';
    for (; (int)addr.sin_zero._0_4_ < 3; addr.sin_zero._0_4_ = addr.sin_zero._0_4_ + 1) {
      addr.sin_zero._4_4_ = epoll_wait(event.data.fd,(epoll_event *)&i,1,300);
      if (addr.sin_zero._4_4_ != 0) {
        if (addr.sin_zero._4_4_ != 1) {
          microatf_fail_require
                    ("%s:%d: %s not met",
                     "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
                     ,0x56,"ret == 1");
        }
        if (i != 0x14) {
          microatf_fail_require
                    ("%s:%d: %s not met",
                     "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
                     ,0x57,"event.events == (EPOLLOUT | EPOLLHUP)");
        }
      }
    }
  }
  memset(local_3c,0,0x10);
  local_3c._0_2_ = 2;
  local_3c._2_2_ = htons(0x539);
  iVar1 = inet_pton(2,"127.0.0.1",local_3c + 4);
  if (iVar1 != 1) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x5e,"inet_pton(AF_INET, \"127.0.0.1\", &addr.sin_addr) == 1");
  }
  iVar1 = connect(event.data.u64._4_4_,(sockaddr *)local_3c,0x10);
  if (iVar1 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x61,"connect(sock, (struct sockaddr const *)&addr, sizeof(addr)) == 0");
  }
  return (void *)SEXT48(event.data.ptr._4_4_);
}

Assistant:

static void *
connector_client(void *arg)
{
	(void)arg;

	int sock = socket(PF_INET, SOCK_STREAM | SOCK_CLOEXEC, 0);
	ATF_REQUIRE(sock >= 0);

	if (connector_epfd >= 0) {
		int ep = connector_epfd;

		struct epoll_event event;
		event.events = EPOLLOUT | EPOLLIN;
		event.data.fd = sock;

		ATF_REQUIRE(epoll_ctl(ep, EPOLL_CTL_ADD, sock, &event) == 0);

		int ret;

		for (int i = 0; i < 3; ++i) {
			ret = epoll_wait(ep, &event, 1, 300);
#ifndef EV_FORCEONESHOT
			if (ret == 0) {
				continue;
			}
#endif
			ATF_REQUIRE(ret == 1);
			ATF_REQUIRE(event.events == (EPOLLOUT | EPOLLHUP));
		}
	}

	struct sockaddr_in addr = { 0 };
	addr.sin_family = AF_INET;
	addr.sin_port = htons(1337);
	ATF_REQUIRE(inet_pton(AF_INET, "127.0.0.1", &addr.sin_addr) == 1);

	ATF_REQUIRE(
	    connect(sock, (struct sockaddr const *)&addr, sizeof(addr)) == 0);

	return (void *)(intptr_t)sock;
}